

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,OutputPartData *part)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  Data *pDVar3;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_003e1cd0;
  psVar2 = Header::type_abi_cxx11_((Header *)part);
  __n = psVar2->_M_string_length;
  if (__n == DAT_003e5cb0) {
    if (__n != 0) {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_00167e50;
    }
    pDVar3 = (Data *)operator_new(0x180);
    Data::Data(pDVar3,*(int *)(part + 0x48));
    this->_data = pDVar3;
    pDVar3->_streamData = *(OutputStreamMutex **)(part + 0x58);
    pDVar3->_deleteStream = false;
    initialize(this,(Header *)part);
    pDVar3 = this->_data;
    pDVar3->partNumber = *(int *)(part + 0x4c);
    pDVar3->lineOffsetsPosition = *(Int64 *)(part + 0x38);
    pDVar3->previewPosition = *(Int64 *)(part + 0x40);
    pDVar3->multipart = (bool)part[0x50];
    return;
  }
LAB_00167e50:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (this_00,"Can\'t build a DeepScanLineOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile(const OutputPartData* part)
{
    try
    {
        if (part->header.type() != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepScanLineOutputFile from a type-mismatched part.");

        _data = new Data (part->numThreads);
        _data->_streamData = part->mutex;
        _data->_deleteStream=false;
        initialize (part->header);
        _data->partNumber = part->partNumber;
        _data->lineOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition = part->previewPosition;
	_data->multipart=part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data;

        REPLACE_EXC (e, "Cannot initialize output part "
                     "\"" << part->partNumber << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}